

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::ProcessBPInfoPostBreak(ExecutionInfoManager *this,FunctionBody *fb)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  DebugManager *pDVar4;
  TTDebuggerAbortException *__return_storage_ptr__;
  int64 targetEventTime;
  FunctionBody *fb_local;
  ExecutionInfoManager *this_local;
  
  pSVar2 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
  bVar1 = Js::ScriptContext::ShouldPerformReplayDebuggerAction(pSVar2);
  if (bVar1) {
    bVar1 = TTDebuggerSourceLocation::HasValue(&this->m_activeTTDBP);
    if (bVar1) {
      pSVar2 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
      pTVar3 = Js::ScriptContext::GetThreadContext(pSVar2);
      ClearActiveBPInfo(this,pTVar3->TTDContext);
    }
    bVar1 = TTDebuggerSourceLocation::HasValue(&this->m_pendingTTDBP);
    if (bVar1) {
      pSVar2 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
      pTVar3 = Js::ScriptContext::GetThreadContext(pSVar2);
      pDVar4 = ThreadContext::GetDebugManager(pTVar3);
      Js::StepController::Deactivate(&pDVar4->stepController,(InterpreterHaltState *)0x0);
      __return_storage_ptr__ = (TTDebuggerAbortException *)__cxa_allocate_exception(0x20);
      targetEventTime = TTDebuggerSourceLocation::GetRootEventTime(&this->m_pendingTTDBP);
      TTDebuggerAbortException::CreateTopLevelAbortRequest
                (__return_storage_ptr__,targetEventTime,this->m_pendingTTDMoveMode,
                 L"Reverse operation requested.");
      __cxa_throw(__return_storage_ptr__,&TTDebuggerAbortException::typeinfo,
                  TTDebuggerAbortException::~TTDebuggerAbortException);
    }
  }
  return;
}

Assistant:

void ExecutionInfoManager::ProcessBPInfoPostBreak(Js::FunctionBody* fb)
    {
        if(!fb->GetScriptContext()->ShouldPerformReplayDebuggerAction())
        {
            return;
        }

        if(this->m_activeTTDBP.HasValue())
        {
            this->ClearActiveBPInfo(fb->GetScriptContext()->GetThreadContext()->TTDContext);
        }

        if(this->m_pendingTTDBP.HasValue())
        {
            //Reset any step controller logic
            fb->GetScriptContext()->GetThreadContext()->GetDebugManager()->stepController.Deactivate();

            throw TTD::TTDebuggerAbortException::CreateTopLevelAbortRequest(this->m_pendingTTDBP.GetRootEventTime(), this->m_pendingTTDMoveMode, _u("Reverse operation requested."));
        }
    }